

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O2

void __thiscall helics::zeromq::ZmqCommsSS::~ZmqCommsSS(ZmqCommsSS *this)

{
  ~ZmqCommsSS(this);
  operator_delete(this,0x4c0);
  return;
}

Assistant:

ZmqCommsSS::~ZmqCommsSS()
{
    if (requestDisconnect.load() || disconnecting.load()) {
        auto status = getRxStatus();
        while (status != ConnectionStatus::TERMINATED && status != ConnectionStatus::ERRORED) {
            std::this_thread::yield();
            status = getRxStatus();
        }
    } else {
        disconnect();
    }
}